

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall HFactor::buildSimple(HFactor *this)

{
  pointer *ppcVar1;
  double dVar2;
  int iVar3;
  HighsInt *pHVar4;
  iterator iVar5;
  iterator iVar6;
  pointer piVar7;
  pointer piVar8;
  pointer piVar9;
  pointer piVar10;
  pointer piVar11;
  pointer piVar12;
  pointer pdVar13;
  vector<double,_std::allocator<double>_> *pvVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  int *piVar19;
  double *pdVar20;
  int8_t *__args;
  int iVar21;
  iterator iVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  size_type sVar28;
  uint uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int8_t pivot_type;
  HighsInt iMat;
  HighsInt iRow_1;
  HighsInt iRow;
  char local_11d;
  int local_11c;
  undefined8 local_118;
  int local_10c;
  vector<int,std::allocator<int>> *local_108;
  vector<int,std::allocator<int>> *local_100;
  vector<int,std::allocator<int>> *local_f8;
  size_type local_f0;
  double local_e8;
  vector<double,_std::allocator<double>_> *local_e0;
  vector<int,std::allocator<int>> *local_d8;
  vector<int,_std::allocator<int>_> *local_d0;
  vector<double,_std::allocator<double>_> *local_c8;
  ulong local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  long local_b0;
  vector<signed_char,std::allocator<signed_char>> *local_a8;
  vector<int,std::allocator<int>> *local_a0;
  vector<int,std::allocator<int>> *local_98;
  vector<int,_std::allocator<int>_> *local_90;
  vector<double,std::allocator<double>> *local_88;
  vector<int,std::allocator<int>> *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  long local_70;
  double local_68;
  long local_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  luClear(this);
  iVar26 = this->num_basic;
  std::vector<int,_std::allocator<int>_>::resize(&this->permute,(long)iVar26);
  local_118 = (double)CONCAT44(local_118._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->permute,(long)iVar26,(value_type_conflict2 *)&local_118);
  if (0 < (long)this->num_row) {
    memset((this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start,0,(long)this->num_row << 2);
  }
  iVar26 = 0;
  this->nwork = 0;
  sVar28 = (long)this->num_basic + 1;
  local_118 = (double)((ulong)local_118 & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->iwork,sVar28,(value_type_conflict2 *)&local_118);
  local_118 = (double)((ulong)local_118 & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->iwork,sVar28,(value_type_conflict2 *)&local_118);
  if (0 < this->num_basic) {
    local_d0 = &this->l_start;
    local_d8 = (vector<int,std::allocator<int>> *)&this->u_pivot_index;
    local_e0 = &this->u_pivot_value;
    local_f8 = (vector<int,std::allocator<int>> *)&this->u_start;
    local_100 = (vector<int,std::allocator<int>> *)&(this->refactor_info_).pivot_row;
    local_108 = (vector<int,std::allocator<int>> *)&(this->refactor_info_).pivot_var;
    lVar17 = 0;
    iVar26 = 0;
    do {
      local_11c = this->basic_index[lVar17];
      local_10c = -1;
      local_11d = -1;
      if (local_11c < this->num_col) {
        iVar15 = this->a_start[local_11c];
        lVar16 = (long)iVar15;
        iVar21 = this->a_start[(long)local_11c + 1];
        if ((((iVar21 - iVar15 != 1) || (this->a_value[lVar16] != 1.0)) ||
            (NAN(this->a_value[lVar16]))) ||
           ((this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[this->a_index[lVar16]] < 0)) {
          if (iVar15 < iVar21) {
            piVar7 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pHVar4 = this->a_index;
            pdVar20 = this->a_value;
            piVar8 = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar13 = (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar25 = 0;
            do {
              piVar19 = piVar7 + pHVar4[lVar16 + lVar25];
              *piVar19 = *piVar19 + 1;
              piVar8[iVar26 + lVar25] = pHVar4[lVar16 + lVar25];
              pdVar13[iVar26 + lVar25] = pdVar20[lVar16 + lVar25];
              lVar25 = lVar25 + 1;
            } while (iVar21 - lVar16 != lVar25);
            iVar26 = iVar26 + (int)lVar25;
          }
LAB_003709a9:
          iVar15 = this->nwork;
          this->nwork = iVar15 + 1;
          (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar15] = (int)lVar17;
        }
        else {
          local_11d = '\x03';
          local_10c = this->a_index[lVar16];
        }
      }
      else {
        iVar21 = local_11c - this->num_col;
        piVar7 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar15 = piVar7[iVar21];
        if (iVar15 < 0) {
          piVar7[iVar21] = iVar15 + 1;
          (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar26] = iVar21;
          (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar26] = 1.0;
          iVar26 = iVar26 + 1;
          goto LAB_003709a9;
        }
        local_11d = '\0';
        local_10c = iVar21;
      }
      if (-1 < local_10c) {
        (this->permute).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar17] = local_10c;
        iVar15 = (int)((ulong)((long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_118 = (double)CONCAT44(local_118._4_4_,iVar15);
        iVar5._M_current =
             (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (local_d0,iVar5,(int *)&local_118);
        }
        else {
          *iVar5._M_current = iVar15;
          (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar5._M_current =
             (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_d8,iVar5,&local_10c);
        }
        else {
          *iVar5._M_current = local_10c;
          (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        local_118 = 1.0;
        iVar6._M_current =
             (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (local_e0,iVar6,(double *)&local_118);
        }
        else {
          *iVar6._M_current = 1.0;
          (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        iVar15 = (int)((ulong)((long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        local_118 = (double)CONCAT44(local_118._4_4_,iVar15);
        iVar5._M_current =
             (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_f8,iVar5,(int *)&local_118);
        }
        else {
          *iVar5._M_current = iVar15;
          (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[local_10c] = -this->num_basic;
        iVar5._M_current =
             (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_100,iVar5,&local_10c);
        }
        else {
          *iVar5._M_current = local_10c;
          (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar5._M_current =
             (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_108,iVar5,&local_11c);
        }
        else {
          *iVar5._M_current = local_11c;
          (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar22._M_current =
             (this->refactor_info_).pivot_type.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar22._M_current ==
            (this->refactor_info_).pivot_type.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<signed_char,std::allocator<signed_char>>::
          _M_realloc_insert<signed_char_const&>
                    ((vector<signed_char,std::allocator<signed_char>> *)
                     &(this->refactor_info_).pivot_type,iVar22,&local_11d);
        }
        else {
          *iVar22._M_current = local_11d;
          ppcVar1 = &(this->refactor_info_).pivot_type.
                     super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
      }
      (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar17 + 1] = iVar26;
      (this->b_var).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar17] = local_11c;
      lVar17 = lVar17 + 1;
    } while (lVar17 < this->num_basic);
  }
  iVar15 = this->num_row - this->nwork;
  this->basis_matrix_num_el = iVar15 + iVar26;
  this->build_synthetic_tick = (double)(iVar15 * 0x50 + iVar26 * 0x3c) + this->build_synthetic_tick;
  local_d8 = (vector<int,std::allocator<int>> *)&this->l_index;
  lVar17 = (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  lVar16 = lVar17 >> 2;
  auVar31._8_4_ = (int)(lVar17 >> 0x22);
  auVar31._0_8_ = lVar16;
  auVar31._12_4_ = 0x45300000;
  dStack_40 = auVar31._8_8_ - 1.9342813113834067e+25;
  local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0);
  local_f8 = (vector<int,std::allocator<int>> *)&this->u_index;
  lVar17 = (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  lVar16 = lVar17 >> 2;
  auVar32._8_4_ = (int)(lVar17 >> 0x22);
  auVar32._0_8_ = lVar16;
  auVar32._12_4_ = 0x45300000;
  dStack_50 = auVar32._8_8_ - 1.9342813113834067e+25;
  local_68 = (double)this->nwork;
  local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0);
  local_100 = (vector<int,std::allocator<int>> *)&this->u_value;
  local_e0 = &this->l_value;
  local_78 = &this->l_start;
  local_80 = (vector<int,std::allocator<int>> *)&this->u_pivot_index;
  local_88 = (vector<double,std::allocator<double>> *)&this->u_pivot_value;
  local_90 = &this->u_start;
  local_98 = (vector<int,std::allocator<int>> *)&(this->refactor_info_).pivot_row;
  local_a0 = (vector<int,std::allocator<int>> *)&(this->refactor_info_).pivot_var;
  local_a8 = (vector<signed_char,std::allocator<signed_char>> *)&(this->refactor_info_).pivot_type;
  local_e8 = 0.0;
  do {
    lVar17 = (long)this->nwork;
    if (lVar17 < 1) break;
    this->nwork = 0;
    sVar28 = 0;
    local_70 = lVar17;
    do {
      piVar7 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar26 = piVar7[sVar28];
      local_c8 = (vector<double,_std::allocator<double>_> *)(long)iVar26;
      uVar27 = piVar8[(long)local_c8];
      lVar16 = (long)(int)uVar27;
      iVar15 = piVar8[(long)local_c8 + 1];
      local_108 = (vector<int,std::allocator<int>> *)(long)iVar15;
      uVar18 = 0;
      local_b8 = (vector<int,_std::allocator<int>_> *)CONCAT44(local_b8._4_4_,iVar15 - uVar27);
      local_c0 = CONCAT44(local_c0._4_4_,uVar27);
      if (iVar15 - uVar27 == 0 || iVar15 < (int)uVar27) {
        bVar30 = true;
        uVar29 = 0xffffffff;
      }
      else {
        uVar29 = 0xffffffff;
        bVar30 = false;
        uVar23 = uVar27;
        lVar25 = lVar16;
        do {
          lVar24 = lVar25 + 1;
          iVar15 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar25]];
          uVar18 = (1 < iVar15) + uVar18;
          if (0 < iVar15) {
            uVar29 = uVar23;
          }
          if (iVar15 == 1) {
            bVar30 = true;
            break;
          }
          uVar23 = uVar23 + 1;
          lVar25 = lVar24;
        } while (lVar24 < (long)local_108);
        bVar30 = !bVar30;
        uVar18 = (uint)(uVar18 == 1);
      }
      if (bVar30) {
        if ((char)uVar18 == '\0') {
          iVar15 = this->nwork;
          this->nwork = iVar15 + 1;
          piVar7[iVar15] = iVar26;
        }
        else {
          iVar26 = uVar29 - uVar27;
          local_f0 = sVar28;
          if (iVar26 != 0 && (int)uVar27 <= (int)uVar29) {
            lVar25 = lVar16 * 4;
            lVar16 = lVar16 << 3;
            do {
              piVar19 = (int *)((long)(this->b_index).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar25);
              iVar5._M_current =
                   (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_f8,iVar5,piVar19);
              }
              else {
                *iVar5._M_current = *piVar19;
                (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar5._M_current + 1;
              }
              pdVar20 = (double *)
                        ((long)(this->b_value).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar16);
              iVar6._M_current =
                   (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)local_100,iVar6,pdVar20);
              }
              else {
                *iVar6._M_current = *pdVar20;
                (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
              lVar25 = lVar25 + 4;
              lVar16 = lVar16 + 8;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          iVar26 = uVar29 + 1;
          if (iVar26 < (int)local_108) {
            lVar16 = (long)iVar26 * 4;
            lVar25 = (long)iVar26 << 3;
            iVar26 = ~uVar29 + (int)local_108;
            do {
              piVar19 = (int *)((long)(this->b_index).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar16);
              iVar5._M_current =
                   (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar5._M_current ==
                  (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_f8,iVar5,piVar19);
              }
              else {
                *iVar5._M_current = *piVar19;
                (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar5._M_current + 1;
              }
              pdVar20 = (double *)
                        ((long)(this->b_value).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar25);
              iVar6._M_current =
                   (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar6._M_current ==
                  (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                          ((vector<double,std::allocator<double>> *)local_100,iVar6,pdVar20);
              }
              else {
                *iVar6._M_current = *pdVar20;
                (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar6._M_current + 1;
              }
              lVar16 = lVar16 + 4;
              lVar25 = lVar25 + 8;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          pvVar14 = local_c8;
          iVar26 = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar29];
          local_118 = (double)CONCAT44(local_118._4_4_,iVar26);
          (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[iVar26] = 0;
          (this->permute).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(long)local_c8] = iVar26;
          local_11c = (int)((ulong)((long)(this->l_index).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                   (long)(this->l_index).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start) >> 2);
          iVar5._M_current =
               (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (local_78,iVar5,&local_11c);
          }
          else {
            *iVar5._M_current = local_11c;
            (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          sVar28 = local_f0;
          iVar5._M_current =
               (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_80,iVar5,(int *)&local_118);
          }
          else {
            *iVar5._M_current = (int)local_118;
            (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          pdVar20 = (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + (int)uVar29;
          iVar6._M_current =
               (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      (local_88,iVar6,pdVar20);
          }
          else {
            *iVar6._M_current = *pdVar20;
            (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar6._M_current + 1;
          }
          local_11c = (int)((ulong)((long)(this->u_index).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                   (long)(this->u_index).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start) >> 2);
          iVar5._M_current =
               (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (local_90,iVar5,&local_11c);
          }
          else {
            *iVar5._M_current = local_11c;
            (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          iVar5._M_current =
               (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_98,iVar5,(int *)&local_118);
          }
          else {
            *iVar5._M_current = (int)local_118;
            (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          iVar5._M_current =
               (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_a0,iVar5,this->basic_index + (long)pvVar14);
          }
          else {
            *iVar5._M_current = this->basic_index[(long)pvVar14];
            (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          iVar22._M_current =
               (this->refactor_info_).pivot_type.
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar22._M_current ==
              (this->refactor_info_).pivot_type.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            __args = "\x03\x04buildRankDeficiency0:";
            goto LAB_00371455;
          }
          *iVar22._M_current = '\x03';
LAB_0037143d:
          ppcVar1 = &(this->refactor_info_).pivot_type.
                     super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
      }
      else {
        local_60 = (long)(int)uVar29;
        local_d0 = (vector<int,_std::allocator<int>_> *)
                   (1.0 / (this->b_value).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[local_60]);
        local_b0 = CONCAT44(local_b0._4_4_,uVar29 + 1);
        local_f0 = sVar28;
        iVar26 = 0;
        do {
          iVar15 = (int)local_b0;
          if (iVar26 == 0) {
            iVar15 = (int)local_c0;
          }
          uVar27 = (uint)local_108;
          if (iVar26 == 0) {
            uVar27 = uVar29;
          }
          iVar21 = uVar27 - iVar15;
          if (iVar21 != 0 && iVar15 <= (int)uVar27) {
            lVar16 = (long)iVar15;
            lVar17 = lVar16 * 8;
            do {
              local_11c = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar16];
              if ((this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_11c] < 1) {
                iVar5._M_current =
                     (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_f8,iVar5,&local_11c);
                }
                else {
                  *iVar5._M_current = local_11c;
                  (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                }
                pdVar20 = (double *)
                          ((long)(this->b_value).super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar17);
                iVar6._M_current =
                     (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar6._M_current ==
                    (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                            ((vector<double,std::allocator<double>> *)local_100,iVar6,pdVar20);
                }
                else {
                  *iVar6._M_current = *pdVar20;
                  (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar6._M_current + 1;
                }
              }
              else {
                iVar5._M_current =
                     (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (local_d8,iVar5,&local_11c);
                }
                else {
                  *iVar5._M_current = local_11c;
                  (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                }
                local_118 = (this->b_value).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar16] * (double)local_d0;
                iVar6._M_current =
                     (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar6._M_current ==
                    (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (local_e0,iVar6,(double *)&local_118);
                }
                else {
                  *iVar6._M_current = local_118;
                  (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar6._M_current + 1;
                }
              }
              piVar19 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start + local_11c;
              *piVar19 = *piVar19 + -1;
              lVar16 = lVar16 + 1;
              lVar17 = lVar17 + 8;
              iVar21 = iVar21 + -1;
            } while (iVar21 != 0);
          }
          lVar16 = local_60;
          pvVar14 = local_c8;
          bVar30 = iVar26 == 0;
          iVar26 = iVar26 + 1;
        } while (bVar30);
        iVar26 = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_60];
        local_118 = (double)CONCAT44(local_118._4_4_,iVar26);
        (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar26] = 0;
        (this->permute).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[(long)local_c8] = iVar26;
        local_11c = (int)((ulong)((long)(this->l_index).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2);
        iVar5._M_current =
             (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_78,iVar5,&local_11c);
        }
        else {
          *iVar5._M_current = local_11c;
          (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        sVar28 = local_f0;
        iVar5._M_current =
             (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_80,iVar5,(int *)&local_118);
        }
        else {
          *iVar5._M_current = (int)local_118;
          (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        lVar17 = local_70;
        pdVar20 = (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar16;
        iVar6._M_current =
             (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    (local_88,iVar6,pdVar20);
        }
        else {
          *iVar6._M_current = *pdVar20;
          (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar6._M_current + 1;
        }
        local_11c = (int)((ulong)((long)(this->u_index).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2);
        iVar5._M_current =
             (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(local_90,iVar5,&local_11c);
        }
        else {
          *iVar5._M_current = local_11c;
          (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar5._M_current =
             (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_98,iVar5,(int *)&local_118);
        }
        else {
          *iVar5._M_current = (int)local_118;
          (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar5._M_current =
             (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (local_a0,iVar5,this->basic_index + (long)pvVar14);
        }
        else {
          *iVar5._M_current = this->basic_index[(long)pvVar14];
          (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
        iVar22._M_current =
             (this->refactor_info_).pivot_type.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar22._M_current !=
            (this->refactor_info_).pivot_type.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *iVar22._M_current = '\x02';
          goto LAB_0037143d;
        }
        __args = "\x02\x03\x04buildRankDeficiency0:";
LAB_00371455:
        std::vector<signed_char,std::allocator<signed_char>>::_M_realloc_insert<signed_char_const&>
                  (local_a8,iVar22,__args);
      }
      local_e8 = local_e8 + (double)(int)local_b8;
      sVar28 = sVar28 + 1;
    } while (sVar28 != lVar17);
  } while ((int)lVar17 != this->nwork);
  lVar17 = (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  lVar16 = lVar17 >> 2;
  auVar33._8_4_ = (int)(lVar17 >> 0x22);
  auVar33._0_8_ = lVar16;
  auVar33._12_4_ = 0x45300000;
  lVar17 = (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  lVar25 = lVar17 >> 2;
  auVar34._8_4_ = (int)(lVar17 >> 0x22);
  auVar34._0_8_ = lVar25;
  auVar34._12_4_ = 0x45300000;
  this->build_synthetic_tick =
       local_e8 * 20.0 +
       ((local_68 - (double)this->nwork) +
        (((auVar33._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0)) - local_48) +
       (((auVar34._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0)) - local_58)) * 80.0 +
       this->build_synthetic_tick;
  local_118._0_4_ = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->row_link_first,(long)this->num_basic + 1,(value_type_conflict2 *)&local_118);
  sVar28 = 0;
  local_118._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->mr_count,(long)this->num_row,(value_type_conflict2 *)&local_118);
  this->kernel_num_el = 0;
  if (0 < this->num_row) {
    piVar7 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar9 = (this->mr_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar10 = (this->row_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar11 = (this->row_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar12 = (this->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar17 = 0;
    sVar28 = 0;
    do {
      iVar26 = piVar7[lVar17];
      lVar16 = (long)iVar26;
      if (0 < lVar16) {
        piVar8[lVar17] = (int)sVar28;
        piVar9[lVar17] = iVar26 * 2;
        iVar15 = piVar10[lVar16];
        piVar11[lVar17] = -2 - iVar26;
        piVar12[lVar17] = iVar15;
        piVar10[lVar16] = (int)lVar17;
        if (-1 < (long)iVar15) {
          piVar11[iVar15] = (int)lVar17;
        }
        sVar28 = (size_type)(uint)((int)sVar28 + iVar26 * 2);
        this->kernel_num_el = iVar26 + this->kernel_num_el + 1;
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < this->num_row);
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->mr_index,sVar28);
  local_118._0_4_ = -1;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->col_link_first,(long)this->num_row + 1,(value_type_conflict2 *)&local_118);
  piVar7 = (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar7) {
    (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar7;
  }
  iVar26 = this->num_basic;
  pdVar13 = (this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar13) {
    (this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar13;
  }
  iVar15 = 0;
  local_118._0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->mc_count_a,(long)iVar26,(value_type_conflict2 *)&local_118);
  local_118 = (double)((ulong)local_118._4_4_ << 0x20);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->mc_count_n,(long)iVar26,(value_type_conflict2 *)&local_118);
  iVar26 = this->nwork;
  local_f0 = sVar28;
  if (0 < iVar26) {
    local_b8 = &this->mc_index;
    local_c8 = &this->mc_value;
    local_b0 = 0;
    local_c0 = 0;
    do {
      iVar26 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[local_b0];
      local_e8 = (double)CONCAT44(local_e8._4_4_,iVar26);
      lVar16 = (long)iVar26;
      (this->mc_var).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar16] =
           (this->b_var).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar16];
      (this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar16] = (int)local_c0;
      piVar7 = (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar15 = piVar7[lVar16 + 1] - piVar7[lVar16];
      (this->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar16] = iVar15 * 2;
      uVar27 = (int)local_c0 + iVar15 * 2;
      local_c0 = (ulong)uVar27;
      std::vector<int,_std::allocator<int>_>::resize(local_b8,(long)(int)uVar27);
      std::vector<double,_std::allocator<double>_>::resize(local_c8,(long)(int)uVar27);
      piVar7 = (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar17 = (long)piVar7[lVar16];
      if (piVar7[lVar16] < piVar7[lVar16 + 1]) {
        local_d0 = (vector<int,_std::allocator<int>_> *)
                   (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_d8 = (vector<int,std::allocator<int>> *)
                   (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        piVar8 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar9 = (this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_100 = (vector<int,std::allocator<int>> *)
                    (this->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_108 = (vector<int,std::allocator<int>> *)
                    (this->mc_count_n).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        piVar10 = (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar13 = (this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar11 = (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_e0 = (vector<double,_std::allocator<double>_> *)
                   (this->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        piVar12 = (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_f8 = (vector<int,std::allocator<int>> *)
                   (this->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        do {
          iVar15 = *(int *)((long)&(local_d0->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                   .super__Vector_impl_data._M_start + lVar17 * 4);
          dVar2 = *(double *)(local_d8 + lVar17 * 8);
          lVar25 = (long)iVar15;
          if (piVar8[lVar25] < 1) {
            iVar21 = *(int *)((vector<double,std::allocator<double>> *)local_100 + lVar16 * 4);
            iVar3 = piVar9[lVar16];
            uVar27 = *(uint *)(local_108 + lVar16 * 4);
            *(uint *)(local_108 + lVar16 * 4) = uVar27 + 1;
            iVar21 = ~uVar27 + iVar21 + iVar3;
            piVar10[iVar21] = iVar15;
            pdVar13[iVar21] = dVar2;
          }
          else {
            iVar21 = piVar9[lVar16];
            iVar3 = piVar11[lVar16];
            piVar11[lVar16] = iVar3 + 1;
            lVar24 = (long)iVar21 + (long)iVar3;
            piVar10[lVar24] = iVar15;
            pdVar13[lVar24] = dVar2;
            iVar15 = *(int *)((long)&(local_e0->super__Vector_base<double,_std::allocator<double>_>)
                                     ._M_impl.super__Vector_impl_data._M_start + lVar25 * 4);
            iVar21 = piVar12[lVar25];
            piVar12[lVar25] = iVar21 + 1;
            *(int *)(local_f8 + ((long)iVar15 + (long)iVar21) * 4) = iVar26;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < piVar7[lVar16 + 1]);
      }
      colFixMax(this,iVar26);
      piVar7 = (this->col_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar15 = (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar16];
      iVar21 = piVar7[iVar15];
      piVar8 = (this->col_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8[lVar16] = -2 - iVar15;
      (this->col_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar16] = iVar21;
      piVar7[iVar15] = iVar26;
      if (-1 < (long)iVar21) {
        piVar8[iVar21] = local_e8._0_4_;
      }
      local_b0 = local_b0 + 1;
      iVar26 = this->nwork;
      iVar15 = (int)local_c0;
    } while (local_b0 < iVar26);
  }
  this->build_synthetic_tick =
       (double)((int)local_f0 * 0x14 + (iVar15 + iVar26 + this->num_row) * 0x28) +
       this->build_synthetic_tick;
  this->kernel_dim = iVar26;
  return;
}

Assistant:

void HFactor::buildSimple() {
  /**
   * 0. Clear L and U factor
   */
  luClear();

  const bool progress_report = false;
  const HighsInt progress_frequency = 100000;

  // Set all values of permute to -1 so that unpermuted (rank
  // deficient) columns can be identified
  const HighsInt permute_dim = num_basic;
  // Strictly not necessary, but nice if it's the right size
  permute.resize(permute_dim);
  permute.assign(permute_dim, -1);

  /**
   * 1. Prepare basis matrix and deal with unit columns
   */
  const bool report_unit = false;
  const bool report_singletons = false;
  const bool report_markowitz = false;
  const bool report_anything =
      report_unit || report_singletons || report_markowitz;
  HighsInt BcountX = 0;
  fill_n(mr_count_before.data(), num_row, 0);
  nwork = 0;
  if (report_anything) printf("\nFactor\n");
  // Compile a vector iwork of the indices within basic_index of the
  // its nwork non-unit structural columns: they will be formed into
  // the B matrix as the kernel
  const HighsInt iwork_dim = num_basic;
  // Strictly not necessary, but nice if it's the right size
  iwork.resize(iwork_dim + 1, 0);
  iwork.assign(iwork_dim + 1, 0);
  for (HighsInt iCol = 0; iCol < num_basic; iCol++) {
    if (progress_report && iCol) {
      if (iCol % progress_frequency == 0)
        printf("HFactor::buildSimple stage = %6d\n", (int)iCol);
    }

    HighsInt iMat = basic_index[iCol];
    HighsInt iRow = -1;
    int8_t pivot_type = kPivotIllegal;
    // Look for unit columns as pivots. If there is already a pivot
    // corresponding to the nonzero in a unit column - evidenced by
    // mr_count_before[iRow] being negative - then, obviously, it
    // can't be used. However, it doesn't imply an error, or even rank
    // deficiency now that build() is being used to determine
    // rank. Treat it as a column to be handled in the kernel, so that
    // any rank deficiency or singularity is detected as late as
    // possible.
    if (iMat >= num_col) {
      // 1.1 Logical column
      //
      // Check for double pivot
      HighsInt lc_iRow = iMat - num_col;
      if (mr_count_before[lc_iRow] >= 0) {
        if (report_unit)
          printf("Stage %d: Logical\n", (int)(l_start.size() - 1));
        pivot_type = kPivotLogical;
        iRow = lc_iRow;
      } else {
        mr_count_before[lc_iRow]++;
        b_index[BcountX] = lc_iRow;
        b_value[BcountX++] = 1.0;
        iwork[nwork++] = iCol;
      }
    } else {
      // 1.2 Structural column
      HighsInt start = a_start[iMat];
      HighsInt count = a_start[iMat + 1] - start;
      // If this column and all subsequent columns are zero (so count
      // is 0) then a_index[start] and a_value[start] are unassigned,
      // so determine a unit column in two stages
      bool ok_unit_col = false;
      if (count == 1) {
        // Column has only one nonzero, but have to make sure that the
        // value is 1 and that there's not already a pivot
        // corresponding to this unit column
        ok_unit_col =
            a_value[start] == 1 && mr_count_before[a_index[start]] >= 0;
      }
      if (ok_unit_col) {
        if (report_unit) printf("Stage %d: Unit\n", (int)(l_start.size() - 1));
        // Don't exploit this special case in case the matrix is
        // re-factorized after scaling has been applied, making this
        // column non-unit.
        pivot_type = kPivotColSingleton;  //;kPivotUnit;//
        iRow = a_index[start];
      } else {
        for (HighsInt k = start; k < start + count; k++) {
          mr_count_before[a_index[k]]++;
          assert(BcountX < (HighsInt)b_index.size());
          b_index[BcountX] = a_index[k];
          b_value[BcountX++] = a_value[k];
        }
        iwork[nwork++] = iCol;
      }
    }

    if (iRow >= 0) {
      // 1.3 Record unit column
      permute[iCol] = iRow;
      l_start.push_back(l_index.size());
      u_pivot_index.push_back(iRow);
      u_pivot_value.push_back(1);
      u_start.push_back(u_index.size());
      // Was -num_row, but this is incorrect since the negation needs
      // to be great enough so that, starting from it, the accumulated
      // count can never reach zero
      mr_count_before[iRow] = -num_basic;
      assert(pivot_type != kPivotIllegal);
      this->refactor_info_.pivot_row.push_back(iRow);
      this->refactor_info_.pivot_var.push_back(iMat);
      this->refactor_info_.pivot_type.push_back(pivot_type);
    }
    b_start[iCol + 1] = BcountX;
    b_var[iCol] = iMat;
  }
  // Record the number of elements in the basis matrix
  basis_matrix_num_el = num_row - nwork + BcountX;

  // count1 = 0;
  // Comments: for pds-20, dfl001: 60 / 80
  // Comments: when system is large: enlarge
  // Comments: when system is small: decrease
  build_synthetic_tick += BcountX * 60 + (num_row - nwork) * 80;

  /**
   * 2. Search for and deal with singletons
   */
  double t2_search = 0;
  double t2_store_l = l_index.size();
  double t2_store_u = u_index.size();
  double t2_store_p = nwork;
  while (nwork > 0) {
    HighsInt nworkLast = nwork;
    nwork = 0;
    for (HighsInt i = 0; i < nworkLast; i++) {
      const HighsInt iCol = iwork[i];
      const HighsInt start = b_start[iCol];
      const HighsInt end = b_start[iCol + 1];
      HighsInt pivot_k = -1;
      HighsInt found_row_singleton = 0;
      HighsInt count = 0;

      // 2.1 Search for singleton
      t2_search += end - start;
      for (HighsInt k = start; k < end; k++) {
        const HighsInt iRow = b_index[k];
        if (mr_count_before[iRow] == 1) {
          pivot_k = k;
          found_row_singleton = 1;
          break;
        }
        if (mr_count_before[iRow] > 1) {
          pivot_k = k;
          count++;
        }
      }

      if (found_row_singleton) {
        // 2.2 Deal with row singleton
        const double pivot_multiplier = 1 / b_value[pivot_k];
        if (report_singletons)
          printf("Stage %d: Row singleton (%4d, %g)\n",
                 (int)(l_start.size() - 1), (int)pivot_k, pivot_multiplier);
        for (HighsInt section = 0; section < 2; section++) {
          HighsInt p0 = section == 0 ? start : pivot_k + 1;
          HighsInt p1 = section == 0 ? pivot_k : end;
          for (HighsInt k = p0; k < p1; k++) {
            HighsInt iRow = b_index[k];
            if (mr_count_before[iRow] > 0) {
              if (report_singletons)
                printf("Row singleton: L En (%4d, %11.4g)\n", (int)iRow,
                       b_value[k] * pivot_multiplier);
              l_index.push_back(iRow);
              l_value.push_back(b_value[k] * pivot_multiplier);
            } else {
              if (report_singletons)
                printf("Row singleton: U En (%4d, %11.4g)\n", (int)iRow,
                       b_value[k]);
              u_index.push_back(iRow);
              u_value.push_back(b_value[k]);
            }
            mr_count_before[iRow]--;
          }
        }
        HighsInt iRow = b_index[pivot_k];
        mr_count_before[iRow] = 0;
        permute[iCol] = iRow;
        l_start.push_back(l_index.size());

        if (report_singletons)
          printf("Row singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 b_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(b_value[pivot_k]);
        u_start.push_back(u_index.size());
        assert(b_var[iCol] == basic_index[iCol]);

        this->refactor_info_.pivot_row.push_back(iRow);
        this->refactor_info_.pivot_var.push_back(basic_index[iCol]);
        this->refactor_info_.pivot_type.push_back(kPivotRowSingleton);
      } else if (count == 1) {
        if (report_singletons)
          printf("Stage %d: Col singleton \n", (int)(l_start.size() - 1));
        // 2.3 Deal with column singleton
        for (HighsInt k = start; k < pivot_k; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)b_index[k],
                   b_value[k]);
          u_index.push_back(b_index[k]);
          u_value.push_back(b_value[k]);
        }
        for (HighsInt k = pivot_k + 1; k < end; k++) {
          if (report_singletons)
            printf("Col singleton: U En (%4d, %11.4g)\n", (int)b_index[k],
                   b_value[k]);
          u_index.push_back(b_index[k]);
          u_value.push_back(b_value[k]);
        }

        HighsInt iRow = b_index[pivot_k];
        mr_count_before[iRow] = 0;
        permute[iCol] = iRow;
        l_start.push_back(l_index.size());

        if (report_singletons)
          printf("Col singleton: U Pv (%4d, %11.4g)\n", (int)iRow,
                 b_value[pivot_k]);
        u_pivot_index.push_back(iRow);
        u_pivot_value.push_back(b_value[pivot_k]);
        u_start.push_back(u_index.size());
        assert(b_var[iCol] == basic_index[iCol]);
        this->refactor_info_.pivot_row.push_back(iRow);
        this->refactor_info_.pivot_var.push_back(basic_index[iCol]);
        this->refactor_info_.pivot_type.push_back(kPivotColSingleton);
      } else {
        iwork[nwork++] = iCol;
      }
    }

    // No singleton found in the last pass
    if (nworkLast == nwork) break;
  }
  if (report_anything) reportLu(kReportLuBoth, false);
  t2_store_l = static_cast<double>(l_index.size()) - t2_store_l;
  t2_store_u = static_cast<double>(u_index.size()) - t2_store_u;
  t2_store_p = t2_store_p - nwork;

  build_synthetic_tick +=
      t2_search * 20 + (t2_store_p + t2_store_l + t2_store_u) * 80;

  /**
   * 3. Prepare the kernel parts
   */
  // 3.1 Prepare row links, row matrix spaces
  row_link_first.assign(num_basic + 1, -1);
  mr_count.assign(num_row, 0);
  HighsInt mr_countX = 0;
  // Determine the number of entries in the kernel
  kernel_num_el = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt count = mr_count_before[iRow];
    if (count > 0) {
      mr_start[iRow] = mr_countX;
      mr_space[iRow] = count * 2;
      mr_countX += count * 2;
      rlinkAdd(iRow, count);
      kernel_num_el += count + 1;
    }
  }
  mr_index.resize(mr_countX);

  // 3.2 Prepare column links, kernel matrix
  col_link_first.assign(num_row + 1, -1);
  const HighsInt mc_dim = num_basic;
  mc_index.clear();
  mc_value.clear();
  mc_count_a.assign(mc_dim, 0);
  mc_count_n.assign(mc_dim, 0);
  HighsInt MCcountX = 0;
  for (HighsInt i = 0; i < nwork; i++) {
    HighsInt iCol = iwork[i];
    mc_var[iCol] = b_var[iCol];
    mc_start[iCol] = MCcountX;
    mc_space[iCol] = (b_start[iCol + 1] - b_start[iCol]) * 2;
    MCcountX += mc_space[iCol];
    mc_index.resize(MCcountX);
    mc_value.resize(MCcountX);
    for (HighsInt k = b_start[iCol]; k < b_start[iCol + 1]; k++) {
      const HighsInt iRow = b_index[k];
      const double value = b_value[k];
      if (mr_count_before[iRow] > 0) {
        colInsert(iCol, iRow, value);
        rowInsert(iCol, iRow);
      } else {
        colStoreN(iCol, iRow, value);
      }
    }
    colFixMax(iCol);
    clinkAdd(iCol, mc_count_a[iCol]);
  }
  build_synthetic_tick += (num_row + nwork + MCcountX) * 40 + mr_countX * 20;
  // Record the kernel dimension
  kernel_dim = nwork;
  assert((HighsInt)this->refactor_info_.pivot_row.size() == num_basic - nwork);
}